

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O0

void regress(reg_object obj,double *x,double *y,double *res,double *varcovar,double alpha)

{
  uint uVar1;
  double *anv;
  double *ci_lower;
  double *ci_upper;
  double *sigma2_00;
  double dVar2;
  double dVar3;
  double dVar4;
  int local_ec;
  double *local_c0;
  double pi;
  double N2;
  double ssr;
  int dfm;
  int k;
  int p2;
  int i;
  int p;
  double *sigma2;
  double *up;
  double *low;
  double *b2;
  double *anv2;
  double alpha_local;
  double *varcovar_local;
  double *res_local;
  double *y_local;
  double *x_local;
  reg_object obj_local;
  
  local_ec = obj->p;
  obj->alpha = alpha;
  anv = (double *)malloc(0x38);
  if (local_ec == 0) {
    local_c0 = (double *)0x0;
  }
  else {
    local_c0 = (double *)malloc((long)local_ec << 3);
  }
  ci_lower = (double *)malloc((long)(local_ec + 1) << 3);
  ci_upper = (double *)malloc((long)(local_ec + 1) << 3);
  sigma2_00 = (double *)malloc(8);
  linreg_multi(local_ec,x,y,obj->N,local_c0,sigma2_00,varcovar,obj->R2,res,alpha,anv,ci_lower,
               ci_upper,&obj->rank,obj->lls,obj->intercept);
  obj->df = obj->N - obj->p;
  obj->sigma = *sigma2_00;
  obj->sigma_lower = ci_lower[local_ec];
  obj->sigma_upper = ci_upper[local_ec];
  obj->TSS = *anv;
  obj->ESS = anv[1];
  obj->RSS = anv[2];
  obj->df_ESS = (int)anv[3];
  obj->df_RSS = (int)anv[4];
  obj->FStat = anv[5];
  obj->PVal = anv[6];
  obj->r2 = obj->R2[0];
  obj->r2adj = obj->R2[1];
  for (k = 0; k < local_ec; k = k + 1) {
    obj->beta[k].value = local_c0[k];
    obj->beta[k].lower = ci_lower[k];
    obj->beta[k].upper = ci_upper[k];
    dVar2 = sqrt(varcovar[(local_ec + 1) * k]);
    obj->beta[k].stdErr = dVar2;
  }
  dVar2 = (double)obj->N / 2.0;
  N2 = 0.0;
  for (k = 0; k < obj->N; k = k + 1) {
    N2 = res[k] * res[k] + N2;
  }
  dVar3 = log(6.283185307179586);
  dVar4 = log(N2 / (double)obj->N);
  obj->loglik = (-dVar2 * dVar3 + -(dVar2 * dVar4)) - dVar2;
  uVar1 = (uint)(obj->intercept == 1);
  if (obj->intercept == 1) {
    local_ec = local_ec + -1;
  }
  obj->aic = (double)(int)(uVar1 + local_ec) * 2.0 - (obj->loglik + obj->loglik);
  dVar2 = obj->loglik;
  dVar3 = log((double)obj->N);
  obj->bic = dVar3 * (double)(int)(uVar1 + local_ec) - (dVar2 + dVar2);
  obj->aicc = (double)local_ec * 2.0 *
              ((double)obj->N / (((double)obj->N - (double)local_ec) - 1.0) - 1.0) + obj->aic;
  free(anv);
  free(local_c0);
  free(ci_upper);
  free(ci_lower);
  free(sigma2_00);
  return;
}

Assistant:

void regress(reg_object obj, double *x, double *y, double *res, double *varcovar, double alpha) {
	double *anv2, *b2, *low, *up, *sigma2;
	int p, i, p2, k, dfm;
	double ssr, N2, pi;
	/*
	* obj - Regression object created by reg_init
	*  x - Vector containing (p - 1 ) independent regression variables of length N each
	*  y - Vector containing dependent regression variable of length N
	*  res - Residual vector of length N
	* varcovar - Variance-Covariance Matrix of p regression parameters. Dimension p X p
	* alpha is used to determine confidence interval limits
	* for a given 100*(1-alpha) % confidence interval
	* eg., alpha = 0.05 if you want to determine 95% confidence interval values
	*/
	p = obj->p;
	obj->alpha = alpha;
	anv2 = (double*)malloc(sizeof(double) * 7);
	b2 = p == 0 ? NULL : (double*)malloc(sizeof(double) * p);
	low = (double*)malloc(sizeof(double) * (p + 1));
	up = (double*)malloc(sizeof(double) * (p + 1));
	sigma2 = (double*)malloc(sizeof(double) * 1);

	pi = 3.141592653589793;


	linreg_multi(p, x, y, obj->N, b2, sigma2, varcovar,
		obj->R2, res, alpha, anv2, low, up, &obj->rank, obj->lls, obj->intercept);
	obj->df = obj->N - obj->p;

	obj->sigma = sigma2[0];
	obj->sigma_lower = low[p];
	obj->sigma_upper = up[p];

	obj->TSS = anv2[0];
	obj->ESS = anv2[1];
	obj->RSS = anv2[2];
	obj->df_ESS = (int)anv2[3];
	obj->df_RSS = (int)anv2[4];
	obj->FStat = anv2[5];
	obj->PVal = anv2[6];
	obj->r2 = obj->R2[0];
	obj->r2adj = obj->R2[1];

	for (i = 0; i < p; ++i) {
		(obj->beta + i)->value = b2[i];
		(obj->beta + i)->lower = low[i];
		(obj->beta + i)->upper = up[i];
		(obj->beta + i)->stdErr = sqrt(varcovar[(p + 1)*i]);
	}

	// Log Likelihood

	N2 = (double)(obj->N) / 2.0;

	ssr = 0.0;

	for (i = 0; i < obj->N; ++i) {
		ssr += (res[i] * res[i]);
	}

	obj->loglik = -N2 * log(2 * pi) - N2 * log(ssr / (double)obj->N) - N2;

	k = obj->intercept == 1 ? 1 : 0;
	dfm = obj->intercept == 1 ? p - 1 : p;

	obj->aic = -2.0 * obj->loglik + 2.0 * (double)(k + dfm);
	obj->bic = -2.0 * obj->loglik + log((double)obj->N) * (double)(k + dfm);
	obj->aicc = obj->aic + 2.0 * dfm * ((double)obj->N / ((double)obj->N - dfm - 1.0) - 1.0);

	free(anv2);
	free(b2);
	free(up);
	free(low);
	free(sigma2);
}